

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

bool __thiscall t_js_generator::has_js_namespace(t_js_generator *this,t_program *p)

{
  bool bVar1;
  string ns;
  allocator local_51;
  string local_50;
  string local_30;
  
  if (this->no_ns_ == false) {
    std::__cxx11::string::string((string *)&local_50,"js",&local_51);
    t_program::get_namespace(&local_30,p,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = local_30._M_string_length != 0;
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool has_js_namespace(t_program* p) {
    if (no_ns_) {
      return false;
    }
    std::string ns = p->get_namespace("js");
    return (ns.size() > 0);
  }